

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O2

void level_tele(void)

{
  bool bVar1;
  d_level dVar2;
  schar sVar3;
  boolean bVar4;
  char cVar5;
  xchar xVar6;
  int iVar7;
  size_t sVar8;
  s_level *psVar9;
  obj *poVar10;
  byte bVar11;
  uint uVar12;
  uint levnum;
  d_level *src;
  char *pcVar13;
  undefined4 uStack_248;
  d_level newlevel;
  xchar destdnum;
  schar destlev;
  char *local_240;
  char buf [256];
  char qbuf [256];
  
  if (((u.uhave._0_1_ & 1) == 0) && (u.uz.dnum != dungeon_topology.d_astral_level.dnum)) {
    if (u.uz.dnum == dungeon_topology.d_sokoban_dnum && flags.debug == '\0') {
LAB_00248a0d:
      pline("You feel very disoriented for a moment.");
      return;
    }
  }
  else if (flags.debug == '\0') goto LAB_00248a0d;
  if ((((u.uprops[0xf].extrinsic == 0 && u.uprops[0xf].intrinsic == 0) &&
       (((youmonst.data)->mflags1 & 0x4000000) == 0)) || (u.uprops[0x1b].intrinsic != 0)) ||
     (u.umonnum == 0x9e)) {
    if (flags.debug != '\0') goto LAB_002487b4;
  }
  else if ((youmonst.data)->mlet != '\x1c' || flags.debug != '\0') {
LAB_002487b4:
    builtin_strncpy(qbuf,"To what level do you want to teleport?",0x27);
    local_240 = "Oops...";
    uVar12 = 0;
    bVar1 = false;
    do {
      bVar4 = flags.debug;
      if (uVar12 == 1) {
        sVar8 = strlen(qbuf);
        if (bVar4 == '\0') {
          builtin_strncpy(qbuf + sVar8," [type a number]",0x11);
        }
        else {
          builtin_strncpy(qbuf + sVar8," [type a number or ? for a menu]",0x21);
        }
      }
      pcVar13 = qbuf;
      getlin(qbuf,buf);
      if (buf._0_2_ == 0x2a) goto LAB_00248c09;
      if (buf._0_2_ == 0x1b) {
        if (u.uprops[0x1c].intrinsic == 0) {
          return;
        }
        iVar7 = rnl((int)pcVar13);
        if (iVar7 == 0) {
          return;
        }
LAB_00248bfd:
        pline(local_240);
        goto LAB_00248c09;
      }
      if (u.uprops[0x1c].intrinsic != 0) {
        iVar7 = rnl((int)pcVar13);
        if (iVar7 != 0) goto LAB_00248bfd;
      }
      if ((flags.debug == '\0') || (buf._0_2_ != 0x3f)) {
        sVar3 = lev_by_name(buf);
        if (sVar3 == '\0') {
          levnum = atoi(buf);
        }
        else {
          levnum = (uint)sVar3;
        }
      }
      else {
        destlev = '\0';
        destdnum = '\0';
        sVar3 = print_dungeon('\x01',&destlev,&destdnum);
        if (sVar3 == '\0') {
          return;
        }
        newlevel.dnum = destdnum;
        newlevel.dlevel = destlev;
        if ((destdnum == dungeon_topology.d_astral_level.dnum) &&
           (u.uz.dnum != dungeon_topology.d_astral_level.dnum)) {
          psVar9 = get_first_elemental_plane();
          builtin_strncpy(buf + 0x20,"lane",5);
          builtin_strncpy(buf,"Destination is first elemental p",0x20);
          if (((u.uhave._0_1_ & 1) == 0) &&
             (poVar10 = mksobj(level,0xd9,'\x01','\0'), poVar10 != (obj *)0x0)) {
            addinv((obj *)CONCAT17(destlev,CONCAT16(destdnum,CONCAT15(newlevel.dlevel,
                                                                      CONCAT14(newlevel.dnum,
                                                                               uStack_248)))));
            sVar8 = strlen(buf);
            builtin_strncpy(buf + sVar8," with the amulet",0x11);
          }
          src = &psVar9->dlevel;
          if (psVar9 == (s_level *)0x0) {
            src = (d_level *)0x0;
          }
          assign_level(&newlevel,src);
          pline("%s.");
        }
        levnum = (uint)sVar3;
        bVar1 = true;
      }
      if (levnum != 0) {
        if ((u.uz.dnum != '\0' && (0 < (int)levnum && flags.debug == '\0')) &&
           (iVar7 = dungeons[u.uz.dnum].depth_start, xVar6 = dunlevs_in_dungeon(&u.uz),
           xVar6 + iVar7 < (int)levnum)) {
          local_240 = "You feel like bouncing off a solid wall!";
          goto LAB_00248bfd;
        }
        bVar4 = on_level(&u.uz,&dungeon_topology.d_knox_level);
        if (bVar4 == '\0') {
          bVar4 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
          if ((0 < (int)levnum) && (bVar4 != '\0')) goto LAB_00248e31;
        }
        else if (0 < (int)levnum) goto LAB_00248e31;
        bVar4 = In_quest(&u.uz);
        if ((0 < (int)levnum) && (bVar4 != '\0')) {
          levnum = (levnum + dungeons[u.uz.dnum].depth_start) - 1;
        }
        goto LAB_00248c24;
      }
      bVar4 = digit(buf[0]);
      if (bVar4 != '\0') goto LAB_00248a55;
      if (buf[0] == '-') {
        bVar4 = digit(buf[1]);
        if ((8 < uVar12) || (bVar4 != '\0')) goto LAB_00248a55;
      }
      else if (8 < uVar12) goto LAB_00248c09;
      uVar12 = uVar12 + 1;
    } while( true );
  }
  bVar1 = false;
  goto LAB_00248c09;
LAB_00248a55:
  if (uVar12 < 9) {
    cVar5 = yn_function("Go to Nowhere.  Are you sure?","ynq",'q');
    if (cVar5 != 'y') {
      return;
    }
    pcVar13 = "scream";
    if ((youmonst.data)->msound == '\0') {
      pcVar13 = "writhe";
    }
    pline("You %s in agony as your body begins to warp...",pcVar13);
    (*windowprocs.win_pause)(P_MESSAGE);
    pline("You cease to exist.");
    if (invent != (obj *)0x0) {
      pcVar13 = surface((int)u.ux,(int)u.uy);
      pline("Your possessions land on the %s with a thud.",pcVar13);
    }
    killer_format = 2;
    killer = "committed suicide";
    done(0);
    pline("An energized cloud of dust begins to coalesce.");
    pcVar13 = ", and you gather up all your possessions";
    if (invent == (obj *)0x0) {
      pcVar13 = "";
    }
    pline("Your body rematerializes%s.",pcVar13);
    return;
  }
LAB_00248c09:
  levnum = random_teleport_level();
  sVar3 = depth(&u.uz);
  if (levnum != (int)sVar3) {
LAB_00248c24:
    bVar4 = next_to_u();
    if (bVar4 != '\0') {
      if (u.uz.dnum == dungeon_topology.d_astral_level.dnum) {
        xVar6 = dunlevs_in_dungeon(&u.uz);
        if (((int)levnum < 0) &&
           (uVar12 = -(int)xVar6,
           levnum != uVar12 && SBORROW4(levnum,uVar12) == (int)(levnum + (int)xVar6) < 0)) {
          newlevel.dnum = u.uz.dnum;
          newlevel.dlevel = xVar6 + (char)levnum;
          schedule_goto(&newlevel,'\0','\0',0,(char *)0x0,(char *)0x0);
          return;
        }
        pcVar13 = "You can\'t get there from here.";
        goto LAB_00248e38;
      }
      killer = (char *)0x0;
      if ((-1 < (int)levnum) || (bVar1)) {
        if ((u.uz.dnum == dungeon_topology.d_medusa_level.dnum) &&
           (iVar7 = dungeons[u.uz.dnum].depth_start, xVar6 = dunlevs_in_dungeon(&u.uz),
           xVar6 + iVar7 <= (int)levnum)) {
          if ((flags.debug == '\0') || (!bVar1)) {
            find_hell(&newlevel);
          }
        }
        else {
          if (((flags.debug == '\0') && (bVar4 = In_hell(&u.uz), bVar4 != '\0')) &&
             ((u.uevent._1_1_ & 2) == 0)) {
            iVar7 = dungeons[u.uz.dnum].depth_start;
            xVar6 = dunlevs_in_dungeon(&u.uz);
            if (xVar6 + iVar7 + -1 <= (int)levnum) {
              iVar7 = dungeons[u.uz.dnum].depth_start;
              xVar6 = dunlevs_in_dungeon(&u.uz);
              levnum = (iVar7 + xVar6) - 2;
              pline("Sorry...");
            }
          }
          bVar4 = In_quest(&u.uz);
          if ((bVar4 != '\0') &&
             (sVar3 = depth(&dungeon_topology.d_qstart_level), (int)levnum < (int)sVar3)) {
            sVar3 = depth(&dungeon_topology.d_qstart_level);
            levnum = (uint)sVar3;
          }
          if ((flags.debug == '\0') || (!bVar1)) {
            get_level(&newlevel,levnum);
          }
        }
        goto LAB_00248f55;
      }
      if (u.ushops0[0] != '\0') {
        in_mklev = '\x01';
        u_left_shop(u.ushops0,'\x01');
        u.ushops[0] = '\0';
        u.ushops0[0] = '\0';
        in_mklev = '\0';
      }
      if (levnum < 0xfffffff7) {
        pline("You arrive in heaven.");
        verbalize("Thou art early, but we\'ll admit thee.");
        killer_format = 2;
        killer = "went to heaven prematurely";
LAB_00248ec4:
        dVar2 = u.uz;
        bVar11 = 0xf6;
        if (0xfffffff6 < levnum) {
          bVar11 = 0;
        }
        u.uz = (d_level)((ushort)bVar11 << 8);
        done(0);
        u.uz = dVar2;
      }
      else {
        if (levnum == 0xfffffff7) {
          pline("You feel deliriously happy. ");
          pline("(In fact, you\'re on Cloud 9!) ");
          (*windowprocs.win_pause)(P_MESSAGE);
        }
        else {
          pline("You are now high above the clouds...");
        }
        if (killer != (char *)0x0) goto LAB_00248ec4;
        if ((((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
             ((youmonst.data)->mlet != '\x05')) && (u.uprops[0x3c].extrinsic == 0)) &&
           ((((youmonst.data)->mflags1 & 1) == 0 &&
            ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 1) == 0)))))) {
          pline("Unfortunately, you don\'t know how to fly.");
          pline("You plummet a few thousand feet to your death.");
          sprintf(buf,"teleported out of the dungeon and fell to %s death",
                  genders[flags.female != '\0'].his);
          killer_format = 2;
          killer = buf;
          goto LAB_00248ec4;
        }
      }
      pline("You %s.");
      newlevel.dnum = '\0';
      newlevel.dlevel = '\0';
LAB_00248f55:
      schedule_goto(&newlevel,'\0','\0',0,(char *)0x0,(char *)0x0);
      if (u.utotype == '\0') {
        return;
      }
      if (flags.mon_moving != '\0') {
        return;
      }
      deferred_goto();
      return;
    }
  }
LAB_00248e31:
  pcVar13 = "You shudder for a moment.";
LAB_00248e38:
  pline(pcVar13);
  return;
}

Assistant:

void level_tele(void)
{
	int newlev;
	d_level newlevel;
	const char *escape_by_flying = 0;	/* when surviving dest of -N */
	char buf[BUFSZ];
	boolean force_dest = FALSE;

	if ((u.uhave.amulet || In_endgame(&u.uz) || In_sokoban(&u.uz))
		&& !wizard) {
	    pline("You feel very disoriented for a moment.");
	    return;
	}
	if ((Teleport_control && !Stunned) || wizard) {
	    char qbuf[BUFSZ];
	    int trycnt = 0;

	    strcpy(qbuf, "To what level do you want to teleport?");
	    do {
		if (++trycnt == 2) {

			if (wizard) strcat(qbuf, " [type a number or ? for a menu]");
			else

			strcat(qbuf, " [type a number]");
		}
		getlin(qbuf, buf);
		if (!strcmp(buf,"\033")) {	/* cancelled */
		    if (Confusion && rnl(5)) {
			pline("Oops...");
			goto random_levtport;
		    }
		    return;
		} else if (!strcmp(buf,"*")) {
		    goto random_levtport;
		} else if (Confusion && rnl(5)) {
		    pline("Oops...");
		    goto random_levtport;
		}

		if (wizard && !strcmp(buf,"?")) {
		    schar destlev = 0;
		    xchar destdnum = 0;

		    if ((newlev = (int)print_dungeon(TRUE, &destlev, &destdnum))) {
			newlevel.dnum = destdnum;
			newlevel.dlevel = destlev;
			if (In_endgame(&newlevel) && !In_endgame(&u.uz)) {
				s_level *first_plane = get_first_elemental_plane();
				sprintf(buf,
				    "Destination is first elemental plane");
				if (!u.uhave.amulet) {
					struct obj *obj;
					obj = mksobj(level, AMULET_OF_YENDOR,
							TRUE, FALSE);
					if (obj) {
						addinv(obj);
						strcat(buf, " with the amulet");
					}
				}
				assign_level(&newlevel, first_plane ? &first_plane->dlevel : NULL);
				pline("%s.", buf);
			}
			force_dest = TRUE;
		    } else return;
		} else

		if ((newlev = lev_by_name(buf)) == 0) newlev = atoi(buf);
	    } while (!newlev && !digit(buf[0]) &&
		     (buf[0] != '-' || !digit(buf[1])) &&
		     trycnt < 10);

	    /* no dungeon escape via this route */
	    if (newlev == 0) {
		if (trycnt >= 10)
		    goto random_levtport;
		if (ynq("Go to Nowhere.  Are you sure?") != 'y') return;
		pline("You %s in agony as your body begins to warp...",
		    is_silent(youmonst.data) ? "writhe" : "scream");
		win_pause_output(P_MESSAGE);
		pline("You cease to exist.");
		if (invent) pline("Your possessions land on the %s with a thud.",
				surface(u.ux, u.uy));
		killer_format = NO_KILLER_PREFIX;
		killer = "committed suicide";
		done(DIED);
		pline("An energized cloud of dust begins to coalesce.");
		pline("Your body rematerializes%s.", invent ?
			", and you gather up all your possessions" : "");
		return;

	    /* only allow jump beyond Dungeons of Doom branch */
	    } else if (!wizard && newlev > 0 && u.uz.dnum != 0) {
		/* random teleport for destination level outside of
		 * the current dungeon branch
		 */
		if (newlev > dungeons[u.uz.dnum].depth_start +
			     dunlevs_in_dungeon(&u.uz)) {
		    pline("You feel like bouncing off a solid wall!");
		    goto random_levtport;
		}
	    }

	    /* if in Knox and the requested level > 0, stay put.
	     * we let negative values requests fall into the "heaven" loop.
	     */
	    if ((Is_knox(&u.uz) || Is_blackmarket(&u.uz)) && newlev > 0) {
		pline("You shudder for a moment.");
		return;
	    }
	    /* if in Quest, the player sees "Home 1", etc., on the status
	     * line, instead of the logical depth of the level.  controlled
	     * level teleport request is likely to be relativized to the
	     * status line, and consequently it should be incremented to
	     * the value of the logical depth of the target level.
	     *
	     * we let negative values requests fall into the "heaven" loop.
	     */
	    if (In_quest(&u.uz) && newlev > 0)
		newlev = newlev + dungeons[u.uz.dnum].depth_start - 1;
	} else { /* involuntary level tele */
 random_levtport:
	    newlev = random_teleport_level();
	    if (newlev == depth(&u.uz)) {
		pline("You shudder for a moment.");
		return;
	    }
	}

	if (!next_to_u()) {
		pline("You shudder for a moment.");
		return;
	}

	if (In_endgame(&u.uz)) {	/* must already be wizard */
	    int llimit = dunlevs_in_dungeon(&u.uz);

	    if (newlev >= 0 || newlev <= -llimit) {
		pline("You can't get there from here.");
		return;
	    }
	    newlevel.dnum = u.uz.dnum;
	    newlevel.dlevel = llimit + newlev;
	    schedule_goto(&newlevel, FALSE, FALSE, 0, NULL, NULL);
	    return;
	}

	killer = 0;		/* still alive, so far... */

	if (newlev < 0 && !force_dest) {
		if (*u.ushops0) {
		    /* take unpaid inventory items off of shop bills */
		    in_mklev = TRUE;	/* suppress map update */
		    u_left_shop(u.ushops0, TRUE);
		    /* you're now effectively out of the shop */
		    *u.ushops0 = *u.ushops = '\0';
		    in_mklev = FALSE;
		}
		if (newlev <= -10) {
			pline("You arrive in heaven.");
			verbalize("Thou art early, but we'll admit thee.");
			killer_format = NO_KILLER_PREFIX;
			killer = "went to heaven prematurely";
		} else if (newlev == -9) {
			pline("You feel deliriously happy. ");
			pline("(In fact, you're on Cloud 9!) ");
			win_pause_output(P_MESSAGE);
		} else
			pline("You are now high above the clouds...");

		if (killer) {
		    ;		/* arrival in heaven is pending */
		} else if (Levitation) {
		    escape_by_flying = "float gently down to earth";
		} else if (Flying) {
		    escape_by_flying = "fly down to the ground";
		} else {
		    pline("Unfortunately, you don't know how to fly.");
		    pline("You plummet a few thousand feet to your death.");
		    sprintf(buf,
			  "teleported out of the dungeon and fell to %s death",
			    uhis());
		    killer = buf;
		    killer_format = NO_KILLER_PREFIX;
		}
	}

	if (killer) {	/* the chosen destination was not survivable */
	    d_level lsav;

	    /* set specific death location; this also suppresses bones */
	    lsav = u.uz;	/* save current level, see below */
	    u.uz.dnum = 0;	/* main dungeon */
	    u.uz.dlevel = (newlev <= -10) ? -10 : 0;	/* heaven or surface */
	    done(DIED);
	    /* can only get here via life-saving (or declining to die in
	       explore|debug mode); the hero has now left the dungeon... */
	    escape_by_flying = "find yourself back on the surface";
	    u.uz = lsav;	/* restore u.uz so escape code works */
	}

	/* calls done(ESCAPED) if newlevel==0 */
	if (escape_by_flying) {
	    pline("You %s.", escape_by_flying);
	    newlevel.dnum = 0;		/* specify main dungeon */
	    newlevel.dlevel = 0;	/* escape the dungeon */
	    /* [dlevel used to be set to 1, but it doesn't make sense to
		teleport out of the dungeon and float or fly down to the
		surface but then actually arrive back inside the dungeon] */
	} else if (u.uz.dnum == medusa_level.dnum &&
	    newlev >= dungeons[u.uz.dnum].depth_start +
						dunlevs_in_dungeon(&u.uz)) {
	    if (!(wizard && force_dest))
		find_hell(&newlevel);
	} else {
	    /* if invocation did not yet occur, teleporting into
	     * the last level of Gehennom is forbidden.
	     */
	    if (!wizard)
	    if (Inhell && !u.uevent.invoked &&
			newlev >= (dungeons[u.uz.dnum].depth_start +
					dunlevs_in_dungeon(&u.uz) - 1)) {
		newlev = dungeons[u.uz.dnum].depth_start +
					dunlevs_in_dungeon(&u.uz) - 2;
		pline("Sorry...");
	    }
	    /* no teleporting out of quest dungeon */
	    if (In_quest(&u.uz) && newlev < depth(&qstart_level))
		newlev = depth(&qstart_level);
	    /* the player thinks of levels purely in logical terms, so
	     * we must translate newlev to a number relative to the
	     * current dungeon.
	     */
	    if (!(wizard && force_dest))
		get_level(&newlevel, newlev);
	}
	schedule_goto(&newlevel, FALSE, FALSE, 0, NULL, NULL);
	/* in case player just read a scroll and is about to be asked to
	   call it something, we can't defer until the end of the turn */
	if (u.utotype && !flags.mon_moving) deferred_goto();
}